

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

int cmdParse(char *buf,uintptr_t *p,uint ext_len,char *ext,cmdCtlParse_t *ctl)

{
  uintptr_t *val;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __int32_t **pp_Var5;
  void *pvVar6;
  size_t sVar7;
  size_t __n;
  uintptr_t uVar8;
  uint uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  int *piVar12;
  char *pcVar13;
  uintptr_t *puVar14;
  int n;
  char *local_90;
  int8_t to3;
  char c;
  uintptr_t tp1;
  uintptr_t *local_78;
  int *local_70;
  int8_t to5;
  int8_t to4;
  uintptr_t *local_60;
  uintptr_t tp3;
  uintptr_t tp2;
  uintptr_t tp5;
  uintptr_t tp4;
  int pp;
  
  tp1 = 0;
  tp2 = 0;
  tp3 = 0;
  tp4 = 0;
  tp5 = 0;
  if (ext_len < 0x800) {
    return -3;
  }
  ctl->opt[0] = '\0';
  ctl->opt[1] = '\0';
  ctl->opt[2] = '\0';
  ctl->opt[3] = '\0';
  lVar11 = 0;
  local_90 = buf;
  local_70 = (int *)ext;
  __isoc99_sscanf(buf + ctl->eaten," %31s %n",intCmdStr,&pp);
  uVar10 = (long)ctl->eaten + (long)pp;
  iVar3 = (int)uVar10;
  ctl->eaten = iVar3;
  *p = 0xffffffffffffffff;
  piVar12 = &cmdInfo[0].vt;
  while( true ) {
    if (lVar11 == 0xa8) {
      intCmdIdx = -1;
      return -1;
    }
    iVar2 = strcasecmp(intCmdStr,*(char **)(piVar12 + -2));
    pcVar13 = local_90;
    if (iVar2 == 0) break;
    lVar11 = lVar11 + 1;
    piVar12 = piVar12 + 8;
  }
  iVar2 = (int)lVar11;
  intCmdIdx = iVar2;
  *p = (long)((cmdInfo_t *)(piVar12 + -4))->cmd;
  puVar14 = p + 1;
  val = p + 2;
  p[1] = 0;
  p[2] = 0;
  p[3] = 0;
  local_78 = val;
  switch(*piVar12) {
  case 0x65:
    break;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x81:
  case 0x82:
    return -2;
  case 0x6f:
    iVar3 = getNum(local_90 + uVar10,puVar14,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar3;
    cVar1 = ctl->opt[1];
    goto joined_r0x00107c1a;
  case 0x70:
    lVar11 = (long)iVar3;
    goto LAB_00107ca2;
  case 0x71:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    uVar10 = *puVar14;
    goto joined_r0x00107d9f;
  case 0x72:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] != '\x01') {
      return -2;
    }
    break;
  case 0x73:
    pcVar13 = local_90 + iVar3;
    sVar7 = strlen(pcVar13);
    p[3] = sVar7;
    memcpy(local_70,pcVar13,sVar7);
    _c = (int)p[3];
    goto LAB_00107e0b;
  case 0x74:
    iVar3 = __isoc99_sscanf(local_90 + iVar3," %*s%n %n",&n,&c);
    if (n == 0 || iVar3 < 0) {
      return -2;
    }
    p[3] = (long)n;
    ctl->opt[3] = '\x01';
    memcpy(local_70,local_90 + ctl->eaten,(long)n);
LAB_00107e0b:
    ctl->eaten = ctl->eaten + _c;
    break;
  case 0x79:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
      return -2;
    }
    cVar1 = ctl->opt[2];
    goto joined_r0x001077f3;
  case 0x7a:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
      return -2;
    }
    goto LAB_00107c16;
  case 0x7b:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (0x95 < *puVar14) {
      return -2;
    }
LAB_00107c16:
    cVar1 = ctl->opt[2];
joined_r0x00107c1a:
    if (cVar1 < '\x01') {
      return -2;
    }
    break;
  case 0x7c:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (0x95 < *puVar14) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    uVar10 = *local_78;
joined_r0x00107d9f:
    if (0x95 < uVar10) {
      return -2;
    }
    break;
  case 0x7d:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = __isoc99_sscanf(pcVar13 + lVar11," %c %n",&c,&n);
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (iVar3 < 1) {
      return -2;
    }
    if ((*puVar14 & 0x80000000) != 0) {
      return -2;
    }
    ctl->eaten = ctl->eaten + n;
    pp_Var5 = __ctype_toupper_loc();
    pvVar6 = memchr("RW540123",(*pp_Var5)[c],9);
    if (pvVar6 == (void *)0x0) {
      return -2;
    }
    iVar3 = 0x10abde;
    goto LAB_00107a43;
  case 0x7e:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = __isoc99_sscanf(pcVar13 + lVar11," %c %n",&c,&n);
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (iVar3 < 1) {
      return -2;
    }
    if ((*puVar14 & 0x80000000) != 0) {
      return -2;
    }
    ctl->eaten = ctl->eaten + n;
    pp_Var5 = __ctype_toupper_loc();
    pvVar6 = memchr("ODU",(*pp_Var5)[c],4);
    if (pvVar6 == (void *)0x0) {
      return -2;
    }
    iVar3 = 0x10abe7;
LAB_00107a43:
    *local_78 = (long)((int)pvVar6 - iVar3);
    break;
  case 0x7f:
    local_60 = puVar14;
    iVar3 = __isoc99_sscanf(local_90 + iVar3," %*s%n %n",&n,&c);
    if (n == 0 || iVar3 < 0) {
      return -2;
    }
    p[3] = (long)n;
    ctl->opt[2] = '\x01';
    memcpy(local_70,pcVar13 + ctl->eaten,(long)n);
    lVar11 = (long)ctl->eaten + (long)_c;
    ctl->eaten = (int)lVar11;
    puVar14 = local_60;
LAB_00107ca2:
    iVar3 = getNum(pcVar13 + lVar11,puVar14,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    iVar3 = (int)*puVar14;
LAB_00107d23:
    if (iVar3 < 0) {
      return -2;
    }
    break;
  case 0x80:
    iVar3 = __isoc99_sscanf(local_90 + iVar3," %*s%n %n",&n,&c);
    piVar12 = local_70;
    if (n == 0 || iVar3 < 0) {
      return -2;
    }
    __n = (size_t)n;
    p[1] = __n;
    memcpy(local_70,local_90 + ctl->eaten,__n);
    ctl->eaten = ctl->eaten + n;
    *(undefined1 *)(__n + (long)piVar12) = 0;
    pcVar13 = local_90 + (long)ctl->eaten + 1;
    sVar7 = strlen(pcVar13);
    iVar3 = (int)sVar7;
    memcpy((undefined1 *)(__n + (long)piVar12) + 1,pcVar13,(long)iVar3);
    ctl->eaten = ctl->eaten + iVar3 + 1;
    p[3] = p[1] + (long)iVar3 + 1;
    break;
  case 0x83:
    local_60 = puVar14;
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,val,ctl->opt + 2);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,&tp1,ctl->opt + 3);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*local_60 & 0x80000000) != 0) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    if ((*local_78 & 0x80000000) != 0) {
      return -2;
    }
    iVar3 = (int)tp1;
    if (iVar3 < 0 || ctl->opt[3] < '\x01') {
      return -2;
    }
    goto LAB_00107b08;
  case 0x84:
    local_60 = puVar14;
    iVar3 = __isoc99_sscanf(local_90 + iVar3," %*s%n %n",&n,&c);
    if (n == 0 || iVar3 < 0) {
      return -2;
    }
    p[3] = (long)n;
    ctl->opt[2] = '\x01';
    memcpy(local_70,pcVar13 + ctl->eaten,(long)n);
    puVar14 = local_60;
    lVar11 = (long)ctl->eaten + (long)_c;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,local_60,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,local_78,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*puVar14 & 0x80000000) != 0) {
      return -2;
    }
    cVar1 = ctl->opt[2];
joined_r0x001077f3:
    if (cVar1 < '\x01') {
      return -2;
    }
    iVar3 = (int)*local_78;
    goto LAB_00107d23;
  case 0x85:
    local_60 = puVar14;
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,val,ctl->opt + 2);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,&tp1,(int8_t *)&n);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*local_60 & 0x80000000) != 0) {
      return -2;
    }
    iVar3 = (int)tp1;
    if ((iVar3 < 0 || (char)n != '\x01') || ctl->opt[2] < '\x01') {
      return -2;
    }
LAB_00107b08:
    p[3] = 4;
    *local_70 = iVar3;
    break;
  case 0x86:
    iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,&tp1,(int8_t *)&n);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,&tp2,&c);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,&tp3,&to3);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,&tp4,&to4);
    lVar11 = (long)iVar3 + (long)ctl->eaten;
    ctl->eaten = (int)lVar11;
    iVar3 = getNum(pcVar13 + lVar11,&tp5,&to5);
    ctl->eaten = ctl->eaten + iVar3;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
      return -2;
    }
    if ((char)n != '\x01') {
      return -2;
    }
    if ((tp1 & 0x80000000) != 0) {
      return -2;
    }
    if (c != '\x01') {
      return -2;
    }
    if ((tp2 & 0x80000000) != 0) {
      return -2;
    }
    if (to3 != '\x01') {
      return -2;
    }
    if ((tp3 & 0x80000000) != 0) {
      return -2;
    }
    if (to4 != '\x01') {
      return -2;
    }
    if ((tp4 & 0x80000000) != 0) {
      return -2;
    }
    if (to5 != '\x01') {
      return -2;
    }
    p[3] = 0x14;
    *local_70 = (int)tp1;
    local_70[1] = (int)tp2;
    local_70[2] = (int)tp3;
    local_70[3] = (int)tp4;
    local_70[4] = (int)tp5;
    break;
  default:
    switch(*piVar12) {
    case 0xbf:
      iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
      ctl->eaten = ctl->eaten + iVar3;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
        return -2;
      }
      for (uVar8 = 0; (int)uVar8 != 0x28; uVar8 = uVar8 + 4) {
        iVar3 = getNum(local_90 + ctl->eaten,&tp1,(int8_t *)&n);
        ctl->eaten = ctl->eaten + iVar3;
        if ((char)n != '\x01') break;
        *(int *)((long)local_70 + uVar8) = (int)tp1;
      }
      goto LAB_00108278;
    case 0xc0:
      iVar3 = 0;
      uVar9 = 0;
      for (uVar8 = 0; (int)uVar8 != 0x800; uVar8 = uVar8 + 4) {
        iVar4 = getNum(local_90 + ctl->eaten,&tp1,(int8_t *)&n);
        ctl->eaten = ctl->eaten + iVar4;
        if ((char)n != '\x01') break;
        uVar9 = uVar9 + 1;
        *(int *)((long)local_70 + uVar8) = (int)tp1;
        iVar3 = iVar3 + -1;
      }
      p[3] = uVar8;
      if (iVar3 + (uVar9 / 3) * 3 != 0 || (int)uVar8 == 0) {
        return -2;
      }
      break;
    case 0xc1:
      iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
      iVar3 = iVar3 + ctl->eaten;
      ctl->eaten = iVar3;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
        return -2;
      }
      for (uVar8 = 0; (int)uVar8 != 0x200; uVar8 = uVar8 + 1) {
        iVar3 = getNum(local_90 + iVar3,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || ((tp1 & 0xffffff00) != 0)) {
          p[3] = uVar8;
          if ((int)uVar8 != 0) {
            return iVar2;
          }
          if (*p == 0x72) {
            return iVar2;
          }
          return -2;
        }
        *(char *)((long)local_70 + uVar8) = (char)tp1;
        iVar3 = iVar3 + ctl->eaten;
        ctl->eaten = iVar3;
      }
      goto LAB_0010826d;
    case 0xc2:
      local_60 = puVar14;
      iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
      lVar11 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar11;
      iVar3 = getNum(pcVar13 + lVar11,val,ctl->opt + 2);
      iVar3 = iVar3 + ctl->eaten;
      ctl->eaten = iVar3;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if (ctl->opt[2] != '\x01') {
        return -2;
      }
      if ((*local_60 & 0x80000000) != 0) {
        return -2;
      }
      if ((*local_78 & 0xffffff00) != 0) {
        return -2;
      }
      for (uVar8 = 0; (int)uVar8 != 0x20; uVar8 = uVar8 + 1) {
        iVar3 = getNum(local_90 + iVar3,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || ((tp1 & 0xffffff00) != 0)) {
LAB_0010825c:
          p[3] = uVar8;
          if ((int)uVar8 != 0) {
            return iVar2;
          }
          return -2;
        }
        *(char *)((long)local_70 + uVar8) = (char)tp1;
        iVar3 = iVar3 + ctl->eaten;
        ctl->eaten = iVar3;
      }
      p[3] = 0x20;
      break;
    case 0xc3:
      iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
      puVar14 = local_78;
      lVar11 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar11;
      if (ctl->opt[1] != '\x01') {
        return iVar2;
      }
      if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
        return -2;
      }
      iVar3 = getNum(pcVar13 + lVar11,local_78,ctl->opt + 2);
      iVar3 = iVar3 + ctl->eaten;
      ctl->eaten = iVar3;
      if (ctl->opt[2] != '\x01') {
        return iVar2;
      }
      if ((*puVar14 & 0x80000000) != 0) {
        return -2;
      }
      for (uVar8 = 0; (int)uVar8 != 0x200; uVar8 = uVar8 + 1) {
        iVar3 = getNum(local_90 + iVar3,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || ((tp1 & 0xffffff00) != 0)) break;
        *(char *)((long)local_70 + uVar8) = (char)tp1;
        iVar3 = iVar3 + ctl->eaten;
        ctl->eaten = iVar3;
      }
LAB_00108278:
      p[3] = uVar8;
      break;
    case 0xc4:
      local_60 = puVar14;
      iVar3 = getNum(local_90 + iVar3,puVar14,ctl->opt + 1);
      lVar11 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar11;
      iVar3 = getNum(pcVar13 + lVar11,val,ctl->opt + 2);
      lVar11 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar11;
      iVar3 = getNum(pcVar13 + lVar11,&tp1,(int8_t *)&n);
      lVar11 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar11;
      iVar3 = getNum(pcVar13 + lVar11,&tp2,&c);
      lVar11 = (long)iVar3 + (long)ctl->eaten;
      ctl->eaten = (int)lVar11;
      iVar3 = getNum(pcVar13 + lVar11,&tp3,&to3);
      ctl->eaten = ctl->eaten + iVar3;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((*local_60 & 0x80000000) != 0) {
        return -2;
      }
      if (ctl->opt[2] != '\x01') {
        return -2;
      }
      if ((int)*local_78 < 1) {
        return -2;
      }
      if ((char)n != '\x01') {
        return -2;
      }
      if (c != '\x01') {
        return -2;
      }
      if (to3 != '\x01') {
        return -2;
      }
      *local_70 = (int)tp1;
      local_70[1] = (int)tp2;
      local_70[2] = (int)tp3;
      for (uVar8 = 0xc; (int)uVar8 != 0x20c; uVar8 = uVar8 + 1) {
        iVar3 = getNum(local_90 + ctl->eaten,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || ((tp1 & 0xffffff00) != 0)) {
          p[3] = uVar8;
          if ((int)uVar8 != 0xc) {
            return iVar2;
          }
          return -2;
        }
        *(char *)((long)local_70 + uVar8) = (char)tp1;
        ctl->eaten = ctl->eaten + iVar3;
      }
      p[3] = 0x20c;
      break;
    case 0xc5:
      for (uVar8 = 0; (int)uVar8 != 0x200; uVar8 = uVar8 + 1) {
        iVar3 = getNum(local_90 + (int)uVar10,&tp1,(int8_t *)&n);
        if (((char)n != '\x01') || ((tp1 & 0xffffff00) != 0)) goto LAB_0010825c;
        *(char *)((long)local_70 + uVar8) = (char)tp1;
        uVar9 = iVar3 + ctl->eaten;
        uVar10 = (ulong)uVar9;
        ctl->eaten = uVar9;
      }
LAB_0010826d:
      p[3] = 0x200;
      break;
    default:
      return -2;
    }
  }
  return iVar2;
}

Assistant:

int cmdParse(
   char *buf, uintptr_t *p, unsigned ext_len, char *ext, cmdCtlParse_t *ctl)
{
   int f, valid, idx, val, pp, pars, n, n2;
   char *p8;
   int32_t *p32;
   char c;
   uintptr_t tp1=0, tp2=0, tp3=0, tp4=0, tp5=0;
   int8_t to1, to2, to3, to4, to5;
   int eaten;

   /* Check that ext is big enough for the largest message. */
   if (ext_len < (4 * CMD_MAX_PARAM)) return CMD_EXT_TOO_SMALL;

   bzero(&ctl->opt, sizeof(ctl->opt));

   sscanf(buf+ctl->eaten, " %31s %n", intCmdStr, &pp);

   ctl->eaten += pp;

   p[0] = -1;

   idx = cmdMatch(intCmdStr);

   intCmdIdx = idx;

   if (idx < 0) return idx;

   valid = 0;

   p[0] = cmdInfo[idx].cmd;
   p[1] = 0;
   p[2] = 0;
   p[3] = 0;

   switch (cmdInfo[idx].vt)
   {
      case 101: /* BR1  BR2  CGI  H  HELP  HWVER
                   DCRA  HALT  INRA  NO
                   PIGPV  POPA  PUSHA  RET  T  TICK  WVBSY  WVCLR
                   WVCRE  WVGO  WVGOR  WVHLT  WVNEW

                   No parameters, always valid.
                */
         valid = 1;

         break;

      case 111: /* ADD  AND  BC1  BC2  BS1  BS2  
                   CMP  CSI  DIV  LDA  LDAB  MLT
                   MOD  OR  RLA  RRA  STAB  SUB  WAIT  XOR

                   One parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] > 0) valid = 1;

         break;

      case 112: /* BI2CC FC  GDC  GPW  I2CC  I2CRB
                   MG  MICS  MILS  MODEG  NC  NP  PADG PFG  PRG
                   PROCD  PROCP  PROCS  PRRG  R  READ  SLRC  SPIC
                   WVDEL  WVSC  WVSM  WVSP  WVTX  WVTXR  BSPIC

                   One positive parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)) valid = 1;

         break;

      case 113: /* DCR  INR  POP  PUSH  STA  XA

                   One register parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 114: /* CALL  JM  JMP  JNZ  JP  JZ  TAG

                   One numeric parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         if (ctl->opt[1] == CMD_NUMERIC) valid = 1;

         break;

      case 115: /* PARSE  PROC

                   One parameter, string (rest of input).
                */
         p[3] = strlen(buf+ctl->eaten);
         memcpy(ext, buf+ctl->eaten, p[3]);
         ctl->eaten += p[3];
         valid = 1;

         break;

      case 116: /* SYS

                   One parameter, a string.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[3] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;
            valid = 1;
         }

         break;

      case 121: /* HC  FR  I2CRD  I2CRR  I2CRW  I2CWB I2CWQ  P
                   PADS  PFS  PRS  PWM  S  SERVO  SLR  SLRI  W
                   WDOG  WRITE  WVTXM

                   Two positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0)) valid = 1;

         break;

      case 122: /* NB

                   Two parameters, first positive, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 123: /* LD  RL  RR

                   Two parameters, first register, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) &&
             (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 124: /* X

                   Two register parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0) && (p[2] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 125: /* M MODES

                   Two parameters, first positive, second in 'RW540123'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtMdeStr, val);

            if (p8 != NULL)
            {
               val = p8 - fmtMdeStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 126: /* PUD

                   Two parameters, first positive, second in 'ODU'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)  && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtPudStr, val);
            if (p8 != NULL)
            {
               val = p8 - fmtPudStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 127: /* FL  FO

                   Two parameters, first a string, other positive.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0))
               valid = 1;
         }

         break;

      case 128: /* SHELL

                   Two string parameters, the first space teminated.
                   The second arbitrary.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);

         if ((f >= 0) && n)
         {
            valid = 1;

            p[1] = n;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n;
            ext[n] = 0; /* terminate first string */

            n2 = strlen(buf+ctl->eaten+1);
            memcpy(ext+n+1, buf+ctl->eaten+1, n2);
            ctl->eaten += n2;
            ctl->eaten ++;
            p[3] = p[1] + n2 + 1;
         }

         break;

      case 131: /* BI2CO  HP  I2CO  I2CPC  I2CRI  I2CWB  I2CWW
                   SLRO  SPIO  TRIG

                   Three positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &ctl->opt[3]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0) &&
             (ctl->opt[3] > 0) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 132: /* SERO

                   Three parameters, first a string, rest >=0
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
            ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
                (ctl->opt[2] > 0) && ((int)p[2] >= 0))
               valid = 1;
         }

         break;

      case 133: /* FS

                   Three parameters.  First and third positive.
                   Second may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 134: /* BSPIO

                   Six parameters.  First to Fifth positive.
                   Sixth may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);
         ctl->eaten += getNum(buf+ctl->eaten, &tp4, &to4);
         ctl->eaten += getNum(buf+ctl->eaten, &tp5, &to5);
                                    
         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0) &&
             (to2 == CMD_NUMERIC) && ((int)tp2 >= 0) &&
             (to3 == CMD_NUMERIC) && ((int)tp3 >= 0) &&
             (to4 == CMD_NUMERIC) && ((int)tp4 >= 0) &&
             (to5 == CMD_NUMERIC))
         {
            p[3] = 5 * 4;
            memcpy(ext+ 0, &tp1, 4);
            memcpy(ext+ 4, &tp2, 4);
            memcpy(ext+ 8, &tp3, 4);
            memcpy(ext+12, &tp4, 4);
            memcpy(ext+16, &tp5, 4);
            valid = 1;
         }

         break;

      case 191: /* PROCR PROCU

                   One to 11 parameters, first positive,
                   optional remainder, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p32 = (int32_t *)ext;

            while (pars < PI_MAX_SCRIPT_PARAMS)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  pars++;
                  *p32++ = tp1;
               }
               else break;
            }

            p[3] = pars * 4;

            valid = 1;
         }

         break;

      case 192: /* WVAG

                   One or more triplets (gpios on, gpios off, delay),
                   any value.
                */

         pars = 0;
         p32 = (int32_t *)ext;

         while (pars < CMD_MAX_PARAM)
         {
            ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               pars++;
               *p32++ = tp1;
            }
            else break;
         }

         p[3] = pars * 4;

         if (pars && ((pars % 3) == 0)) valid = 1;

         break;

      case 193: /* BI2CZ  BSCX  BSPIX  FW  I2CWD  I2CZ  SERW
		   SPIW  SPIX

                   Two or more parameters, first >=0, rest 0-255.

		   BSCX is special case one or more.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p8 = ext;

            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars || (p[0]==PI_CMD_BSCX)) valid = 1;
         }

         break;

      case 194: /* I2CPK  I2CWI  I2CWK

                   Three to 34 parameters, all 0-255.
                */

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] == CMD_NUMERIC) &&
             (ctl->opt[2] == CMD_NUMERIC) &&
             ((int)p[1]>=0) && ((int)p[2]>=0) && ((int)p[2]<=255))
         {
            pars = 0;
            p8 = ext;

            while (pars < 32)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars > 0) valid = 1;
         }

         break;

      case 195: /* CF1  CF2

                   Zero or more parameters, first two >=0, rest 0-255.
                */
         valid = 1;

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] == CMD_NUMERIC)
         {
            if ((int)p[1] >= 0)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

               if (ctl->opt[2] == CMD_NUMERIC)
               {
                  if ((int)p[2] >= 0)
                  {
                     pars = 0;
                     p8 = ext;

                     while (pars < CMD_MAX_PARAM)
                     {
                        eaten = getNum(buf+ctl->eaten, &tp1, &to1);
                        if (to1 == CMD_NUMERIC)
                        {
                           if (((int)tp1>=0) && ((int)tp1<=255))
                           {
                              pars++;
                              *p8++ = tp1;
                              ctl->eaten += eaten;
                           }
                           else break;
                        }
                        else break;
                     }

                     p[3] = pars;
                  }
                  else valid = 0;
               }
            }
            else valid = 0;
         }

         break;

      case 196: /* WVAS

                   gpio baud offset char...

                   p1 gpio
                   p2 baud
                   p3 len + 4
                   ---------
                   uint32_t databits
                   uint32_t stophalfbits
                   uint32_t offset
                   uint8_t[len]
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0) &&
             (ctl->opt[2] == CMD_NUMERIC) && ((int)p[2] > 0) &&
             (to1 == CMD_NUMERIC) &&
             (to2 == CMD_NUMERIC) &&
             (to3 == CMD_NUMERIC))
         {
            pars = 0;

            memcpy(ext, &tp1, 4);
            memcpy(ext+4, &tp2, 4);
            memcpy(ext+8, &tp3, 4);
            p8 = ext + 12;
            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     *p8++ = tp1;
                     pars++;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars + 12;

            if (pars > 0) valid = 1;
         }

         break;

      case 197: /* WVCHA

                   One or more parameters, all 0-255.
                */
         pars = 0;
         p8 = ext;

         while (pars < CMD_MAX_PARAM)
         {
            eaten = getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               if (((int)tp1>=0) && ((int)tp1<=255))
               {
                  pars++;
                  *p8++ = tp1;
                  ctl->eaten += eaten;
               }
               else break; /* invalid number, end of command */
            }
            else break;
         }

         p[3] = pars;

         if (pars) valid = 1;

         break;


   }

   if (valid) return idx; else return CMD_BAD_PARAMETER;
}